

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_OpenStream(PaStream **stream,PaStreamParameters *inputParameters,
                     PaStreamParameters *outputParameters,double sampleRate,
                     unsigned_long framesPerBuffer,PaStreamFlags streamFlags,
                     PaStreamCallback *streamCallback,void *userData)

{
  PaStreamParameters *local_b0;
  PaStreamParameters *hostApiOutputParametersPtr;
  PaStreamParameters *hostApiInputParametersPtr;
  PaStreamParameters hostApiOutputParameters;
  PaStreamParameters hostApiInputParameters;
  PaDeviceIndex hostApiOutputDevice;
  PaDeviceIndex hostApiInputDevice;
  PaUtilHostApiRepresentation *hostApi;
  PaStreamCallback *pPStack_48;
  PaError result;
  PaStreamCallback *streamCallback_local;
  PaStreamFlags streamFlags_local;
  unsigned_long framesPerBuffer_local;
  double sampleRate_local;
  PaStreamParameters *outputParameters_local;
  PaStreamParameters *inputParameters_local;
  PaStream **stream_local;
  
  _hostApiOutputDevice = (PaUtilHostApiRepresentation *)0x0;
  hostApiInputParameters.hostApiSpecificStreamInfo._4_4_ = 0xffffffff;
  hostApiInputParameters.hostApiSpecificStreamInfo._0_4_ = 0xffffffff;
  if (initializationCount_ == 0) {
    stream_local._4_4_ = -10000;
  }
  else if (stream == (PaStream **)0x0) {
    stream_local._4_4_ = -0x2704;
  }
  else {
    pPStack_48 = streamCallback;
    streamCallback_local = (PaStreamCallback *)streamFlags;
    streamFlags_local = framesPerBuffer;
    framesPerBuffer_local = (unsigned_long)sampleRate;
    sampleRate_local = (double)outputParameters;
    outputParameters_local = inputParameters;
    inputParameters_local = (PaStreamParameters *)stream;
    hostApi._4_4_ =
         ValidateOpenStreamParameters
                   (inputParameters,outputParameters,sampleRate,framesPerBuffer,streamFlags,
                    streamCallback,(PaUtilHostApiRepresentation **)&hostApiOutputDevice,
                    (PaDeviceIndex *)((long)&hostApiInputParameters.hostApiSpecificStreamInfo + 4),
                    (PaDeviceIndex *)&hostApiInputParameters.hostApiSpecificStreamInfo);
    stream_local._4_4_ = hostApi._4_4_;
    if (hostApi._4_4_ == 0) {
      if (outputParameters_local == (PaStreamParameters *)0x0) {
        hostApiOutputParametersPtr = (PaStreamParameters *)0x0;
      }
      else {
        hostApiOutputParameters.hostApiSpecificStreamInfo._0_4_ =
             hostApiInputParameters.hostApiSpecificStreamInfo._4_4_;
        hostApiOutputParameters.hostApiSpecificStreamInfo._4_4_ =
             outputParameters_local->channelCount;
        hostApiInputParameters._0_8_ = outputParameters_local->sampleFormat;
        hostApiInputParameters.sampleFormat =
             (PaSampleFormat)outputParameters_local->suggestedLatency;
        hostApiInputParameters.suggestedLatency =
             (PaTime)outputParameters_local->hostApiSpecificStreamInfo;
        hostApiOutputParametersPtr =
             (PaStreamParameters *)&hostApiOutputParameters.hostApiSpecificStreamInfo;
      }
      if (sampleRate_local == 0.0) {
        local_b0 = (PaStreamParameters *)0x0;
      }
      else {
        hostApiInputParametersPtr._0_4_ = hostApiInputParameters.hostApiSpecificStreamInfo._0_4_;
        hostApiInputParametersPtr._4_4_ = *(undefined4 *)((long)sampleRate_local + 4);
        hostApiOutputParameters._0_8_ = *(undefined8 *)((long)sampleRate_local + 8);
        hostApiOutputParameters.sampleFormat = *(PaSampleFormat *)((long)sampleRate_local + 0x10);
        hostApiOutputParameters.suggestedLatency = *(PaTime *)((long)sampleRate_local + 0x18);
        local_b0 = (PaStreamParameters *)&hostApiInputParametersPtr;
      }
      hostApi._4_4_ =
           (*_hostApiOutputDevice->OpenStream)
                     (_hostApiOutputDevice,(PaStream **)inputParameters_local,
                      hostApiOutputParametersPtr,local_b0,(double)framesPerBuffer_local,
                      streamFlags_local,(PaStreamFlags)streamCallback_local,pPStack_48,userData);
      if (hostApi._4_4_ == 0) {
        AddOpenStream(*(PaStream **)inputParameters_local);
      }
      stream_local._4_4_ = hostApi._4_4_;
    }
  }
  return stream_local._4_4_;
}

Assistant:

PaError Pa_OpenStream( PaStream** stream,
                       const PaStreamParameters *inputParameters,
                       const PaStreamParameters *outputParameters,
                       double sampleRate,
                       unsigned long framesPerBuffer,
                       PaStreamFlags streamFlags,
                       PaStreamCallback *streamCallback,
                       void *userData )
{
    PaError result;
    PaUtilHostApiRepresentation *hostApi = 0;
    PaDeviceIndex hostApiInputDevice = paNoDevice, hostApiOutputDevice = paNoDevice;
    PaStreamParameters hostApiInputParameters, hostApiOutputParameters;
    PaStreamParameters *hostApiInputParametersPtr, *hostApiOutputParametersPtr;


#ifdef PA_LOG_API_CALLS
    PA_LOGAPI_ENTER_PARAMS( "Pa_OpenStream" );
    PA_LOGAPI(("\tPaStream** stream: 0x%p\n", stream ));

    if( inputParameters == NULL ){
        PA_LOGAPI(("\tPaStreamParameters *inputParameters: NULL\n" ));
    }else{
        PA_LOGAPI(("\tPaStreamParameters *inputParameters: 0x%p\n", inputParameters ));
        PA_LOGAPI(("\tPaDeviceIndex inputParameters->device: %d\n", inputParameters->device ));
        PA_LOGAPI(("\tint inputParameters->channelCount: %d\n", inputParameters->channelCount ));
        PA_LOGAPI(("\tPaSampleFormat inputParameters->sampleFormat: %d\n", inputParameters->sampleFormat ));
        PA_LOGAPI(("\tPaTime inputParameters->suggestedLatency: %f\n", inputParameters->suggestedLatency ));
        PA_LOGAPI(("\tvoid *inputParameters->hostApiSpecificStreamInfo: 0x%p\n", inputParameters->hostApiSpecificStreamInfo ));
    }

    if( outputParameters == NULL ){
        PA_LOGAPI(("\tPaStreamParameters *outputParameters: NULL\n" ));
    }else{
        PA_LOGAPI(("\tPaStreamParameters *outputParameters: 0x%p\n", outputParameters ));
        PA_LOGAPI(("\tPaDeviceIndex outputParameters->device: %d\n", outputParameters->device ));
        PA_LOGAPI(("\tint outputParameters->channelCount: %d\n", outputParameters->channelCount ));
        PA_LOGAPI(("\tPaSampleFormat outputParameters->sampleFormat: %d\n", outputParameters->sampleFormat ));
        PA_LOGAPI(("\tPaTime outputParameters->suggestedLatency: %f\n", outputParameters->suggestedLatency ));
        PA_LOGAPI(("\tvoid *outputParameters->hostApiSpecificStreamInfo: 0x%p\n", outputParameters->hostApiSpecificStreamInfo ));
    }
    
    PA_LOGAPI(("\tdouble sampleRate: %g\n", sampleRate ));
    PA_LOGAPI(("\tunsigned long framesPerBuffer: %d\n", framesPerBuffer ));
    PA_LOGAPI(("\tPaStreamFlags streamFlags: 0x%x\n", streamFlags ));
    PA_LOGAPI(("\tPaStreamCallback *streamCallback: 0x%p\n", streamCallback ));
    PA_LOGAPI(("\tvoid *userData: 0x%p\n", userData ));
#endif

    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;

        PA_LOGAPI(("Pa_OpenStream returned:\n" ));
        PA_LOGAPI(("\t*(PaStream** stream): undefined\n" ));
        PA_LOGAPI(("\tPaError: %d ( %s )\n", result, Pa_GetErrorText( result ) ));
        return result;
    }

    /* Check for parameter errors.
        NOTE: make sure this validation list is kept syncronised with the one
        in pa_hostapi.h
    */

    if( stream == NULL )
    {
        result = paBadStreamPtr;

        PA_LOGAPI(("Pa_OpenStream returned:\n" ));
        PA_LOGAPI(("\t*(PaStream** stream): undefined\n" ));
        PA_LOGAPI(("\tPaError: %d ( %s )\n", result, Pa_GetErrorText( result ) ));
        return result;
    }

    result = ValidateOpenStreamParameters( inputParameters,
                                           outputParameters,
                                           sampleRate, framesPerBuffer,
                                           streamFlags, streamCallback,
                                           &hostApi,
                                           &hostApiInputDevice,
                                           &hostApiOutputDevice );
    if( result != paNoError )
    {
        PA_LOGAPI(("Pa_OpenStream returned:\n" ));
        PA_LOGAPI(("\t*(PaStream** stream): undefined\n" ));
        PA_LOGAPI(("\tPaError: %d ( %s )\n", result, Pa_GetErrorText( result ) ));
        return result;
    }
    

    if( inputParameters )
    {
        hostApiInputParameters.device = hostApiInputDevice;
        hostApiInputParameters.channelCount = inputParameters->channelCount;
        hostApiInputParameters.sampleFormat = inputParameters->sampleFormat;
        hostApiInputParameters.suggestedLatency = inputParameters->suggestedLatency;
        hostApiInputParameters.hostApiSpecificStreamInfo = inputParameters->hostApiSpecificStreamInfo;
        hostApiInputParametersPtr = &hostApiInputParameters;
    }
    else
    {
        hostApiInputParametersPtr = NULL;
    }

    if( outputParameters )
    {
        hostApiOutputParameters.device = hostApiOutputDevice;
        hostApiOutputParameters.channelCount = outputParameters->channelCount;
        hostApiOutputParameters.sampleFormat = outputParameters->sampleFormat;
        hostApiOutputParameters.suggestedLatency = outputParameters->suggestedLatency;
        hostApiOutputParameters.hostApiSpecificStreamInfo = outputParameters->hostApiSpecificStreamInfo;
        hostApiOutputParametersPtr = &hostApiOutputParameters;
    }
    else
    {
        hostApiOutputParametersPtr = NULL;
    }

    result = hostApi->OpenStream( hostApi, stream,
                                  hostApiInputParametersPtr, hostApiOutputParametersPtr,
                                  sampleRate, framesPerBuffer, streamFlags, streamCallback, userData );

    if( result == paNoError )
        AddOpenStream( *stream );


    PA_LOGAPI(("Pa_OpenStream returned:\n" ));
    PA_LOGAPI(("\t*(PaStream** stream): 0x%p\n", *stream ));
    PA_LOGAPI(("\tPaError: %d ( %s )\n", result, Pa_GetErrorText( result ) ));

    return result;
}